

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# life.cxx
# Opt level: O2

int main(void)

{
  int iVar1;
  __sighandler_t p_Var2;
  system_error *this;
  int *piVar3;
  error_category *__ecat;
  PressedKey PVar4;
  long lVar5;
  array<int,_2UL> signals;
  LinuxKeys linuxKeys;
  OledI2C oled;
  Bitmap pixels;
  
  signals._M_elems[0] = 2;
  signals._M_elems[1] = 0xf;
  lVar5 = 0;
  do {
    if (lVar5 == 8) {
      std::__cxx11::string::string((string *)&pixels,"/dev/i2c-1",(allocator *)&linuxKeys);
      SSD1306::OledI2C::OledI2C(&oled,(string *)&pixels,'<');
      std::__cxx11::string::~string((string *)&pixels);
      pixels.super_OledPixel._vptr_OledPixel = (_func_int **)&PTR__OledPixel_00109bb8;
      memset(&pixels.blocks_,0,0x400);
      newLife(&pixels.super_OledPixel);
      SSD1306::OledPixel::setFrom(&oled.super_OledPixel,&pixels.super_OledPixel,(OledPoint)0x0);
      SSD1306::OledI2C::displayUpdate(&oled);
      LinuxKeys::LinuxKeys(&linuxKeys);
      while ((anonymous_namespace)::run != 0) {
        PVar4 = LinuxKeys::pressed(&linuxKeys);
        if (((ulong)PVar4 & 1) != 0) {
          if ((ulong)PVar4 >> 0x20 == 0x1b) {
            (anonymous_namespace)::run = 0;
          }
          else {
            iVar1 = PVar4.key;
            if (iVar1 == 0x20) {
              newLife(&pixels.super_OledPixel);
            }
            else if (iVar1 == 0x2b) {
              SSD1306::OledI2C::displayOn(&oled);
            }
            else if (iVar1 == 0x2d) {
              SSD1306::OledI2C::displayOff(&oled);
            }
          }
        }
        iterateLife(&pixels);
        SSD1306::OledPixel::setFrom(&oled.super_OledPixel,&pixels.super_OledPixel,(OledPoint)0x0);
        SSD1306::OledI2C::displayUpdate(&oled);
      }
      SSD1306::OledI2C::clear(&oled);
      SSD1306::OledI2C::displayUpdate(&oled);
      LinuxKeys::~LinuxKeys(&linuxKeys);
      SSD1306::OledPixel::~OledPixel(&pixels.super_OledPixel);
      SSD1306::OledI2C::~OledI2C(&oled);
      return 0;
    }
    iVar1 = *(int *)((long)signals._M_elems + lVar5);
    p_Var2 = signal(iVar1,signalHandler);
    lVar5 = lVar5 + 4;
  } while (p_Var2 != (__sighandler_t)0xffffffffffffffff);
  std::__cxx11::string::string((string *)&oled,"installing ",(allocator *)&pixels);
  strsignal(iVar1);
  std::__cxx11::string::append((char *)&oled);
  std::__cxx11::string::append((char *)&oled);
  this = (system_error *)__cxa_allocate_exception(0x20);
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this,iVar1,__ecat,(string *)&oled);
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

int
main()
{
    try
    {
        constexpr std::array<int, 2> signals{SIGINT, SIGTERM};

        for (auto signal : signals)
        {
            if (std::signal(signal, signalHandler) == SIG_ERR)
            {
                std::string what{"installing "};
                what += strsignal(signal);
                what += " signal handler";

                throw std::system_error(errno,
                                        std::system_category(),
                                        what);
            }
        }

       SSD1306::OledI2C oled{"/dev/i2c-1", 0x3C};

        Bitmap pixels;

        newLife(pixels);
        oled.setFrom(pixels);
        oled.displayUpdate();

        LinuxKeys linuxKeys;
        LinuxKeys::PressedKey key;

        //-----------------------------------------------------------------

        while (run)
        {
            key = linuxKeys.pressed();
        
            if (key.isPressed)
            {
                switch (key.key)
                {
                case ' ':

                    newLife(pixels);
                    break;

                case '+':

                    oled.displayOn();
                    break;

                case '-':

                    oled.displayOff();
                    break;

                case 27:

                    run = 0;
                    break;
                }
            }

            iterateLife(pixels);
            oled.setFrom(pixels);
            oled.displayUpdate();
        }

        //-----------------------------------------------------------------

        oled.clear();
        oled.displayUpdate();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << "\n";
    }

    return 0;
}